

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_key
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,key_type *key)

{
  byte __c;
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  char (*extraout_RDX) [2];
  char (*extraout_RDX_00) [2];
  char (*s_00) [2];
  char (*extraout_RDX_01) [5];
  char (*s_01) [5];
  char (*extraout_RDX_02) [5];
  char (*s_02) [5];
  char (*extraout_RDX_03) [5];
  char (*extraout_RDX_04) [5];
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  serializer<toml::type_config> *local_108;
  string local_100 [32];
  location loc;
  region reg;
  
  local_108 = this;
  if (key->_M_string_length == 0) {
    string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
    ::invoke<3ul>(__return_storage_ptr__,
                  (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                   *)0x389f0b,(char (*) [3])key);
  }
  else {
    std::__cxx11::string::string(local_100,key);
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              ((enable_if_t<is_std_basic_string<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                *)&reg,(detail *)local_100,s);
    make_temporary_location(&loc,(string *)&reg);
    std::__cxx11::string::~string((string *)&reg);
    std::__cxx11::string::~string(local_100);
    syntax::unquoted_key((repeat_at_least *)&bStack_128,&local_108->spec_);
    repeat_at_least::scan(&reg,(repeat_at_least *)&bStack_128,&loc);
    s_00 = extraout_RDX;
    if ((long *)bStack_128.field_2._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)bStack_128.field_2._M_allocated_capacity + 8))();
      s_00 = extraout_RDX_00;
    }
    if ((reg.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) ||
       (loc.location_ <
        (ulong)((long)((loc.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)((loc.source_.
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start))) {
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<2ul>(__return_storage_ptr__,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x38cfe9,s_00);
      pcVar1 = (key->_M_dataplus)._M_p;
      sVar2 = key->_M_string_length;
      s_02 = extraout_RDX_01;
      for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
        __c = pcVar1[sVar4];
        s_01 = (char (*) [5])&switchD_0034fe00::switchdataD_003a1450;
        switch(__c) {
        case 8:
          string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
          ::invoke<3ul>(&bStack_128,
                        (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                         *)0x39c1f0,(char (*) [3])&switchD_0034fe00::switchdataD_003a1450);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&bStack_128);
          break;
        case 9:
          string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
          ::invoke<3ul>(&bStack_128,
                        (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                         *)0x3a1ecb,(char (*) [3])&switchD_0034fe00::switchdataD_003a1450);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&bStack_128);
          break;
        case 10:
          string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
          ::invoke<3ul>(&bStack_128,
                        (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                         *)0x39c28c,(char (*) [3])&switchD_0034fe00::switchdataD_003a1450);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&bStack_128);
          break;
        case 0xb:
switchD_0034fe00_caseD_b:
          if ((__c < 9) || (__c == 0x7f || (byte)(__c - 10) < 0x16)) {
            if ((local_108->spec_).v1_1_0_add_escape_sequence_x == true) {
              string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
              ::invoke<3ul>(&bStack_128,
                            (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                             *)"\\x",(char (*) [3])s_01);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(__return_storage_ptr__,&bStack_128);
            }
            else {
              string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
              ::invoke<5ul>(&bStack_128,
                            (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                             *)"\\u00",s_01);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(__return_storage_ptr__,&bStack_128);
            }
            std::__cxx11::string::~string((string *)&bStack_128);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,__c >> 4 | 0x30);
            cVar3 = '0';
            if (9 < (__c & 0xf)) {
              cVar3 = '7';
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,(__c & 0xf) + cVar3);
            s_02 = extraout_RDX_03;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,__c);
            s_02 = extraout_RDX_04;
          }
          goto LAB_0034ff2c;
        case 0xc:
          string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
          ::invoke<3ul>(&bStack_128,
                        (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                         *)0x39c322,(char (*) [3])&switchD_0034fe00::switchdataD_003a1450);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&bStack_128);
          break;
        case 0xd:
          string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
          ::invoke<3ul>(&bStack_128,
                        (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                         *)0x39c370,(char (*) [3])&switchD_0034fe00::switchdataD_003a1450);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&bStack_128);
          break;
        default:
          if (__c == 0x22) {
            string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
            ::invoke<3ul>(&bStack_128,
                          (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                           *)0x3a424d,(char (*) [3])s_02);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,&bStack_128);
          }
          else {
            s_01 = s_02;
            if (__c != 0x5c) goto switchD_0034fe00_caseD_b;
            string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
            ::invoke<3ul>(&bStack_128,
                          (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                           *)"\\\\",(char (*) [3])s_02);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,&bStack_128);
          }
        }
        std::__cxx11::string::~string((string *)&bStack_128);
        s_02 = extraout_RDX_02;
LAB_0034ff2c:
      }
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<2ul>(&bStack_128,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x38cfe9,(char (*) [2])s_02);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&bStack_128);
      std::__cxx11::string::~string((string *)&bStack_128);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,key);
    }
    region::~region(&reg);
    location::~location(&loc);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type format_key(const key_type& key) // {{{
    {
        if(key.empty())
        {
            return string_conv<string_type>("\"\"");
        }

        // check the key can be a bare (unquoted) key
        auto loc = detail::make_temporary_location(string_conv<std::string>(key));
        auto reg = detail::syntax::unquoted_key(this->spec_).scan(loc);
        if(reg.is_ok() && loc.eof())
        {
            return key;
        }

        //if it includes special characters, then format it in a "quoted" key.
        string_type formatted = string_conv<string_type>("\"");
        for(const char_type c : key)
        {
            switch(c)
            {
                case char_type('\\'): {formatted += string_conv<string_type>("\\\\"); break;}
                case char_type('\"'): {formatted += string_conv<string_type>("\\\""); break;}
                case char_type('\b'): {formatted += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {formatted += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {formatted += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {formatted += string_conv<string_type>("\\n" ); break;}
                case char_type('\r'): {formatted += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    // ASCII ctrl char
                    if( (char_type(0x00) <= c && c <= char_type(0x08)) ||
                        (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                        c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            formatted += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            formatted += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        formatted += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            formatted += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            formatted += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        formatted += c;
                    }
                    break;
                }
            }
        }
        formatted += string_conv<string_type>("\"");
        return formatted;
    }